

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void DLevelScript::ChangeFlat(int tag,int name,bool floorOrCeiling)

{
  int iVar1;
  FTextureID FVar2;
  uint uVar3;
  char *name_00;
  sector_t_conflict *this;
  FSectorTagIterator it;
  FSectorTagIterator local_30;
  
  name_00 = FBehavior::StaticLookupString(name);
  if (name_00 != (char *)0x0) {
    FVar2 = FTextureManager::GetTexture(&TexMan,name_00,2,2);
    if (tag == 0) {
      local_30.start = 0;
    }
    else {
      local_30.start = tagManager.TagHashFirst[tag & 0xff];
    }
    local_30.searchtag = tag;
    uVar3 = FSectorTagIterator::Next(&local_30);
    if (-1 < (int)uVar3) {
      do {
        this = sectors + uVar3;
        iVar1 = this->planes[floorOrCeiling].Texture.texnum;
        this->planes[floorOrCeiling].Texture.texnum = FVar2.texnum;
        if ((!floorOrCeiling) && (iVar1 != FVar2.texnum)) {
          sector_t::AdjustFloorClip((sector_t *)this);
        }
        uVar3 = FSectorTagIterator::Next(&local_30);
      } while (-1 < (int)uVar3);
    }
  }
  return;
}

Assistant:

void DLevelScript::ChangeFlat (int tag, int name, bool floorOrCeiling)
{
	FTextureID flat;
	int secnum = -1;
	const char *flatname = FBehavior::StaticLookupString (name);

	if (flatname == NULL)
		return;

	flat = TexMan.GetTexture (flatname, FTexture::TEX_Flat, FTextureManager::TEXMAN_Overridable);

	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		int pos = floorOrCeiling? sector_t::ceiling : sector_t::floor;
		sectors[secnum].SetTexture(pos, flat);
	}
}